

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,unsigned_int>
          (Thread *this)

{
  uint uVar1;
  Simd<unsigned_char,_(unsigned_char)__x10_> value;
  
  uVar1 = Pop<unsigned_int>(this);
  value.v._8_8_ = (ulong)(uVar1 & 0xff) * 0x101010101010101;
  value.v._0_8_ = value.v._8_8_;
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}